

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void opengv::relative_pose::modules::ge_main
               (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,Matrix3d *zxF,
               Matrix<double,_3,_9,_0,_3,_9> *x1P,Matrix<double,_3,_9,_0,_3,_9> *y1P,
               Matrix<double,_3,_9,_0,_3,_9> *z1P,Matrix<double,_3,_9,_0,_3,_9> *x2P,
               Matrix<double,_3,_9,_0,_3,_9> *y2P,Matrix<double,_3,_9,_0,_3,_9> *z2P,
               Matrix<double,_9,_9,_0,_9,_9> *m11P,Matrix<double,_9,_9,_0,_9,_9> *m12P,
               Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *startingPoint,geOutput_t *output)

{
  Matrix3d *yzF_00;
  Matrix3d *zxF_00;
  double *pdVar1;
  long lVar2;
  long lVar3;
  ActualDstType actualDst;
  complex<double> *__return_storage_ptr__;
  cayley_t cayley;
  Vector4d t;
  Vector4d D;
  Matrix<std::complex<double>,_4,_1,_0,_4,_1> D_complex;
  rotation_t R;
  Matrix4d V;
  Matrix4d G;
  Matrix<std::complex<double>,_4,_4,_0,_4,_4> V_complex;
  EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> Eig;
  Matrix<double,__1,_1,_0,__1,_1> local_aa0;
  Matrix3d *local_a90;
  Matrix3d *local_a88;
  Matrix3d *local_a80;
  Matrix3d *local_a78;
  Matrix3d *local_a70;
  Matrix3d *local_a68;
  int local_a5c;
  cayley_t local_a58;
  double local_a40;
  double dStack_a38;
  double dStack_a30;
  double dStack_a28;
  double local_a20 [4];
  double local_a00 [15];
  rotation_t local_988;
  Matrix<double,_4,_4,_0,_4,_4> local_940;
  Matrix4d local_8c0;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>_>
  local_810 [16];
  double local_800;
  Matrix<double,_4,_4,_0,_4,_4> *local_7f8;
  Matrix<double,_4,_4,_0,_4,_4> *local_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined1 local_7c0 [48];
  double *pdStack_790;
  Index IStack_788;
  double *pdStack_780;
  Index local_778;
  double *pdStack_770;
  Index IStack_768;
  double *pdStack_760;
  Index IStack_758;
  Index IStack_750;
  int *piStack_748;
  Index IStack_740;
  Index local_738;
  undefined1 uStack_730;
  undefined7 uStack_72f;
  undefined1 uStack_728;
  undefined7 uStack_727;
  undefined1 uStack_720;
  undefined7 uStack_71f;
  undefined1 uStack_718;
  undefined8 uStack_717;
  NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0> *local_708;
  double *local_6f0;
  Index IStack_6e8;
  double *pdStack_6e0;
  Index IStack_6d8;
  double *pdStack_6d0;
  Index IStack_6c8;
  double *pdStack_6c0;
  Index IStack_6b8;
  NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0> local_648;
  complex<double> local_5c0 [16];
  undefined1 local_4c0 [1168];
  
  local_a5c = 3;
  local_a70 = yzF;
  local_a68 = zxF;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_aa0,&local_a5c);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_aa0,startingPoint);
  zxF_00 = local_a68;
  yzF_00 = local_a70;
  local_708 = &local_648;
  local_648.super_Ge_step.super_OptimizationFunctor<double,__1,__1>.m_inputs = 3;
  local_648.super_Ge_step.super_OptimizationFunctor<double,__1,__1>.m_values = 3;
  local_648.super_Ge_step._yzF = local_a70;
  local_648.super_Ge_step._zxF = local_a68;
  local_648.super_Ge_step._x1P = x1P;
  local_648.super_Ge_step._y1P = y1P;
  local_648.super_Ge_step._z1P = z1P;
  local_648.super_Ge_step._x2P = x2P;
  local_648.super_Ge_step._y2P = y2P;
  local_648.super_Ge_step._z2P = z2P;
  local_648.super_Ge_step._m11P = m11P;
  local_648.super_Ge_step._m12P = m12P;
  IStack_750 = 0;
  piStack_748 = (int *)0x0;
  IStack_740 = 0;
  pdStack_790 = (double *)0x0;
  IStack_788 = 0;
  pdStack_780 = (double *)0x0;
  local_778 = 0;
  pdStack_770 = (double *)0x0;
  IStack_768 = 0;
  pdStack_760 = (double *)0x0;
  IStack_758 = 0;
  local_738 = 0;
  uStack_730 = 0;
  uStack_72f = 0;
  uStack_728 = 0;
  uStack_727 = 0;
  uStack_720 = 0;
  uStack_71f = 0;
  uStack_718 = 0;
  uStack_717 = 0;
  local_6f0 = (double *)0x0;
  IStack_6e8 = 0;
  pdStack_6e0 = (double *)0x0;
  IStack_6d8 = 0;
  pdStack_6d0 = (double *)0x0;
  IStack_6c8 = 0;
  pdStack_6c0 = (double *)0x0;
  IStack_6b8 = 0;
  local_7c0._32_16_ = ZEXT416(0) << 0x40;
  local_7c0._0_8_ = 100.0;
  local_648.super_Ge_step._m22P = m22P;
  local_648.epsfcn = 0.0;
  local_7c0._16_8_ = 1e-06;
  local_7c0._24_8_ = 2.220446049250313e-15;
  local_7c0._8_8_ = 100;
  local_a90 = xxF;
  local_a88 = yyF;
  local_a80 = zzF;
  local_a78 = xyF;
  local_648.super_Ge_step._xxF = xxF;
  local_648.super_Ge_step._yyF = yyF;
  local_648.super_Ge_step._zzF = zzF;
  local_648.super_Ge_step._xyF = xyF;
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
  ::minimize((LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
              *)local_7c0,&local_aa0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_a58,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_aa0);
  math::cayley2rot(&local_988,&local_a58);
  ge::composeG(&local_8c0,local_a90,local_a88,local_a80,local_a78,yzF_00,zxF_00,x1P,y1P,z1P,x2P,y2P,
               z2P,m11P,m12P,m22P,&local_a58);
  Eigen::EigenSolver<Eigen::Matrix<double,4,4,0,4,4>>::EigenSolver<Eigen::Matrix<double,4,4,0,4,4>>
            ((EigenSolver<Eigen::Matrix<double,4,4,0,4,4>> *)local_4c0,
             (EigenBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_8c0,true);
  local_a00[0] = (double)local_4c0._128_8_;
  local_a00[1] = (double)local_4c0._136_8_;
  local_a00[2] = (double)local_4c0._144_8_;
  local_a00[3] = (double)local_4c0._152_8_;
  local_a00[4] = (double)local_4c0._160_8_;
  local_a00[5] = (double)local_4c0._168_8_;
  local_a00[6] = (double)local_4c0._176_8_;
  local_a00[7] = (double)local_4c0._184_8_;
  __return_storage_ptr__ = local_5c0;
  Eigen::EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::eigenvectors
            ((EigenvectorsType *)__return_storage_ptr__,
             (EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_4c0);
  pdVar1 = (double *)&local_940;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    local_a20[lVar2] = local_a00[lVar2 * 2];
    for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 0x20) {
      *(undefined8 *)((long)pdVar1 + lVar3) =
           *(undefined8 *)
            ((((PlainObjectBase<Eigen::Matrix<std::complex<double>,_4,_4,_0,_4,_4>_> *)
              __return_storage_ptr__->_M_value)->m_storage).m_data.array[0]._M_value + lVar3 * 2);
    }
    pdVar1 = pdVar1 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  }
  local_7f8 = &local_940;
  local_800 = 1.0 / local_940.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[3];
  local_7e0 = 0;
  uStack_7d8 = 0;
  local_7d0 = 4;
  local_7e8 = local_7f8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>const>>
            ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&local_a40,local_810);
  (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] = local_a40;
  (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] = dStack_a38;
  (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] = dStack_a30;
  (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] = dStack_a28;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            (&output->rotation,&local_988);
  (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] = local_a20[0];
  (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] = local_a20[1];
  (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] = local_a20[2];
  (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] = local_a20[3];
  Eigen::internal::call_assignment<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>>
            (&output->eigenvectors,&local_940);
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
  ::~LevenbergMarquardt
            ((LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
              *)local_7c0);
  Eigen::internal::handmade_aligned_free
            (local_aa0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  return;
}

Assistant:

void
opengv::relative_pose::modules::ge_main(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & startingPoint,
    geOutput_t & output )
{
  //this one doesn't work, probably because of double numerical differentiation
  //use ge_main2, which is an implementation of gradient descent
  const int n=3;
  VectorXd x(n);

  x = startingPoint;
  Ge_step functor(xxF,yyF,zzF,xyF,yzF,zxF,
      x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P);
  NumericalDiff<Ge_step> numDiff(functor);
  LevenbergMarquardt< NumericalDiff<Ge_step> > lm(numDiff);

  lm.resetParameters();
  lm.parameters.ftol = 0.000001;//1.E1*NumTraits<double>::epsilon();
  lm.parameters.xtol = 1.E1*NumTraits<double>::epsilon();
  lm.parameters.maxfev = 100;
  lm.minimize(x);

  cayley_t cayley = x;
  rotation_t R = math::cayley2rot(cayley);
  
  Eigen::Matrix4d G = ge::composeG(xxF,yyF,zzF,xyF,yzF,zxF,
      x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley);
  
  Eigen::EigenSolver< Eigen::Matrix4d > Eig(G,true);
  Eigen::Matrix<std::complex<double>,4,1> D_complex = Eig.eigenvalues();
  Eigen::Matrix<std::complex<double>,4,4> V_complex = Eig.eigenvectors();
  Eigen::Vector4d D;
  Eigen::Matrix4d V;
  for(size_t i = 0; i < 4; i++)
  {
    D[i] = D_complex[i].real();
    for(size_t j = 0; j < 4; j++)
      V(i,j) = V_complex(i,j).real();
  }

  double factor = V(3,0);
  Eigen::Vector4d t = (1.0/factor) * V.col(0);

  output.translation = t;
  output.rotation = R;
  output.eigenvalues = D;
  output.eigenvectors = V;
}